

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fitscore.c
# Opt level: O1

void ffcdsp(char *tform,char *cform)

{
  byte bVar1;
  char *pcVar2;
  size_t sVar3;
  
  *cform = '\0';
  for (; *tform == 0x20; tform = (char *)((byte *)tform + 1)) {
  }
  if ((*tform != 0) && (pcVar2 = strchr(tform,0x25), pcVar2 == (char *)0x0)) {
    *cform = '%';
    strcpy(cform + 1,(char *)((byte *)tform + 1));
    bVar1 = *tform;
    if (bVar1 < 0x61) {
      switch(bVar1) {
      case 0x41:
switchD_0017f544_caseD_41:
        sVar3 = strlen(cform);
        (cform + sVar3)[0] = 's';
        (cform + sVar3)[1] = '\0';
        return;
      case 0x42:
      case 0x43:
      case 0x48:
      case 0x4a:
      case 0x4b:
      case 0x4c:
      case 0x4d:
      case 0x4e:
        break;
      case 0x44:
      case 0x45:
switchD_0017f544_caseD_44:
        sVar3 = strlen(cform);
        (cform + sVar3)[0] = 'E';
        (cform + sVar3)[1] = '\0';
        return;
      case 0x46:
switchD_0017f544_caseD_46:
        sVar3 = strlen(cform);
        (cform + sVar3)[0] = 'f';
        (cform + sVar3)[1] = '\0';
        return;
      case 0x47:
switchD_0017f544_caseD_47:
        sVar3 = strlen(cform);
        (cform + sVar3)[0] = 'G';
        (cform + sVar3)[1] = '\0';
        return;
      case 0x49:
switchD_0017f544_caseD_49:
        sVar3 = strlen(cform);
        (cform + sVar3)[0] = 'd';
        (cform + sVar3)[1] = '\0';
        return;
      case 0x4f:
switchD_0017f544_caseD_4f:
        sVar3 = strlen(cform);
        (cform + sVar3)[0] = 'o';
        (cform + sVar3)[1] = '\0';
        return;
      default:
        if (bVar1 == 0x5a) {
LAB_0017f5e1:
          sVar3 = strlen(cform);
          (cform + sVar3)[0] = 'X';
          (cform + sVar3)[1] = '\0';
          return;
        }
      }
    }
    else {
      switch(bVar1) {
      case 0x61:
        goto switchD_0017f544_caseD_41;
      case 0x62:
      case 99:
      case 0x68:
      case 0x6a:
      case 0x6b:
      case 0x6c:
      case 0x6d:
      case 0x6e:
        break;
      case 100:
      case 0x65:
        goto switchD_0017f544_caseD_44;
      case 0x66:
        goto switchD_0017f544_caseD_46;
      case 0x67:
        goto switchD_0017f544_caseD_47;
      case 0x69:
        goto switchD_0017f544_caseD_49;
      case 0x6f:
        goto switchD_0017f544_caseD_4f;
      default:
        if (bVar1 == 0x7a) goto LAB_0017f5e1;
      }
    }
  }
  *cform = '\0';
  return;
}

Assistant:

void ffcdsp(char *tform,    /* value of an ASCII table TFORMn keyword */
            char *cform)    /* equivalent format code in C language syntax */
/*
  convert the FITS TDISPn display format into the equivalent C format
  suitable for use in a printf statement.
*/
{
    int ii;

    cform[0] = '\0';
    ii = 0;
    while (tform[ii] != 0 && tform[ii] == ' ') /* find first non-blank char */
         ii++;

    if (tform[ii] == 0)
    {
        cform[0] = '\0';
        return;    /* input format string was blank */
    }

    if (strchr(tform+ii, '%'))  /* is there a % character in the string?? */
    {
        cform[0] = '\0';
        return;    /* illegal TFORM string (possibly even harmful) */
    }

    cform[0] = '%';  /* start the format string */

    strcpy(&cform[1], &tform[ii + 1]); /* append the width and decimal code */

    if      (tform[ii] == 'A' || tform[ii] == 'a')
        strcat(cform, "s");
    else if (tform[ii] == 'I' || tform[ii] == 'i')
        strcat(cform, "d");
    else if (tform[ii] == 'O' || tform[ii] == 'o')
        strcat(cform, "o");
    else if (tform[ii] == 'Z' || tform[ii] == 'z')
        strcat(cform, "X");
    else if (tform[ii] == 'F' || tform[ii] == 'f')
        strcat(cform, "f");
    else if (tform[ii] == 'E' || tform[ii] == 'e')
        strcat(cform, "E");
    else if (tform[ii] == 'D' || tform[ii] == 'd')
        strcat(cform, "E");
    else if (tform[ii] == 'G' || tform[ii] == 'g')
        strcat(cform, "G");
    else
        cform[0] = '\0';  /* unrecognized tform code */

    return;
}